

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall helics::apps::Player::sendInformation(Player *this,Time sendTime,int iteration)

{
  _Elt_pointer pPVar1;
  _Elt_pointer pEVar2;
  pointer pVVar3;
  ulong uVar4;
  void *__n;
  ulong uVar5;
  pointer pVVar6;
  ulong uVar7;
  void *__buf;
  pointer pVVar8;
  pointer pMVar9;
  Publication *pPVar10;
  Endpoint *this_00;
  int in_R8D;
  
  uVar5 = this->pointIndex;
  pVVar8 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (uVar5 < (ulong)((long)pVVar6 - (long)pVVar8 >> 7)) {
    if (pVVar8[uVar5].time.internalTimeCode < sendTime.internalTimeCode) {
      pVVar3 = pVVar8 + uVar5;
      do {
        pPVar1 = (this->publications).
                 super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar5 = ((long)pPVar1 -
                 (long)(this->publications).
                       super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x70a3d70a3d70a3d7
                + (long)pVVar3->index;
        if ((long)uVar5 < 0) {
          uVar4 = (long)uVar5 >> 1;
LAB_002747ec:
          pPVar10 = (this->publications).
                    super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar5 + uVar4 * -2;
        }
        else {
          if (1 < uVar5) {
            uVar4 = uVar5 >> 1;
            goto LAB_002747ec;
          }
          pPVar10 = pPVar1 + pVVar3->index;
        }
        Publication::publishDefV(pPVar10,&pVVar3->value);
        uVar5 = this->pointIndex + 1;
        this->pointIndex = uVar5;
        pVVar8 = (this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar4 = (long)pVVar6 - (long)pVVar8 >> 7;
        if (uVar4 <= uVar5) goto LAB_00274856;
        pVVar3 = pVVar8 + uVar5;
      } while (pVVar8[uVar5].time.internalTimeCode < sendTime.internalTimeCode);
    }
    uVar4 = (long)pVVar6 - (long)pVVar8 >> 7;
LAB_00274856:
    if (uVar5 < uVar4) {
      do {
        if ((pVVar8[uVar5].time.internalTimeCode != sendTime.internalTimeCode) ||
           (pVVar8[uVar5].iteration != iteration)) break;
        pPVar1 = (this->publications).
                 super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        uVar4 = ((long)pPVar1 -
                 (long)(this->publications).
                       super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x70a3d70a3d70a3d7
                + (long)pVVar8[uVar5].index;
        if ((long)uVar4 < 0) {
          uVar7 = (long)uVar4 >> 1;
LAB_002748cc:
          pPVar10 = (this->publications).
                    super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_node[uVar7] + uVar4 + uVar7 * -2;
        }
        else {
          if (1 < uVar4) {
            uVar7 = uVar4 >> 1;
            goto LAB_002748cc;
          }
          pPVar10 = pPVar1 + pVVar8[uVar5].index;
        }
        Publication::publishDefV(pPVar10,&pVVar8[uVar5].value);
        uVar5 = this->pointIndex + 1;
        this->pointIndex = uVar5;
        pVVar8 = (this->points).
                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(this->points).
                                     super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8 >> 7)
              );
    }
  }
  uVar5 = this->messageIndex;
  pMVar9 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->messages).
                 super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 4) *
          -0xf0f0f0f0f0f0f0f;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    do {
      if (sendTime.internalTimeCode < pMVar9[uVar5].sendTime.internalTimeCode) {
        return;
      }
      __buf = (void *)(long)pMVar9[uVar5].index;
      pEVar2 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      __n = (void *)(((long)pEVar2 -
                      (long)(this->endpoints).
                            super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>.
                            _M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
                     -0x1111111111111111 + (long)__buf);
      if ((long)__n < 0) {
        __buf = (void *)((long)__n >> 2);
LAB_002749ae:
        __n = (void *)((long)__n + (long)__buf * -4);
        this_00 = (this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node[(long)__buf] + (long)__n;
      }
      else {
        if ((void *)0x3 < __n) {
          __buf = (void *)((ulong)__n >> 2);
          goto LAB_002749ae;
        }
        this_00 = pEVar2 + (long)__buf;
      }
      Endpoint::send(this_00,(int)(pMVar9 + uVar5) + 0x10,__buf,(size_t)__n,in_R8D);
      uVar5 = this->messageIndex + 1;
      this->messageIndex = uVar5;
      pMVar9 = (this->messages).
               super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)(((long)(this->messages).
                                    super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 4)
                            * -0xf0f0f0f0f0f0f0f));
  }
  return;
}

Assistant:

void Player::sendInformation(Time sendTime, int iteration)
{
    if (isValidIndex(pointIndex, points)) {
        while (points[pointIndex].time < sendTime) {
            publications[points[pointIndex].index].publish(points[pointIndex].value);
            ++pointIndex;
            if (pointIndex >= points.size()) {
                break;
            }
        }
        if (isValidIndex(pointIndex, points)) {
            while ((points[pointIndex].time == sendTime) &&
                   (points[pointIndex].iteration == iteration)) {
                publications[points[pointIndex].index].publish(points[pointIndex].value);
                ++pointIndex;
                if (pointIndex >= points.size()) {
                    break;
                }
            }
        }
    }
    if (isValidIndex(messageIndex, messages)) {
        while (messages[messageIndex].sendTime <= sendTime) {
            endpoints[messages[messageIndex].index].send(messages[messageIndex].mess);
            ++messageIndex;
            if (messageIndex >= messages.size()) {
                break;
            }
        }
    }
}